

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O1

int uv_tty_reset_mode(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  piVar4 = __errno_location();
  iVar2 = termios_spinlock;
  iVar1 = *piVar4;
  LOCK();
  termios_spinlock = 1;
  UNLOCK();
  iVar3 = -0x10;
  if (iVar2 == 0) {
    iVar3 = 0;
    if (orig_termios_fd != -1) {
      iVar3 = uv__tcsetattr(orig_termios_fd,0,&orig_termios);
    }
    LOCK();
    termios_spinlock = 0;
    UNLOCK();
    *piVar4 = iVar1;
  }
  return iVar3;
}

Assistant:

int uv_tty_reset_mode(void) {
  int saved_errno;
  int err;

  saved_errno = errno;

  if (atomic_exchange(&termios_spinlock, 1))
    return UV_EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    err = uv__tcsetattr(orig_termios_fd, TCSANOW, &orig_termios);

  atomic_store(&termios_spinlock, 0);
  errno = saved_errno;

  return err;
}